

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

bool __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>::
recalculate_filter_if_dirty(LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false> *this)

{
  ushort uVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock_guard;
  FilterParameters filter_parameters;
  LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false> *this_local;
  
  FilterParameters::FilterParameters((FilterParameters *)&lock_guard);
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->filter_parameters_mutex_);
  lock_guard._M_device = *(mutex_type **)&this->filter_parameters_;
  uVar1._0_1_ = (this->filter_parameters_).parameters_are_dirty;
  uVar1._1_1_ = (this->filter_parameters_).input_rate_changed;
  (this->filter_parameters_).parameters_are_dirty = false;
  (this->filter_parameters_).input_rate_changed = false;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  if ((uVar1 & 1) != 0) {
    update_filter_coefficients(this,(FilterParameters *)&lock_guard);
  }
  return (bool)(uVar1._1_1_ & 1);
}

Assistant:

bool recalculate_filter_if_dirty() {
			FilterParameters filter_parameters;
			{
				std::lock_guard lock_guard(filter_parameters_mutex_);
				filter_parameters = filter_parameters_;
				filter_parameters_.parameters_are_dirty = false;
				filter_parameters_.input_rate_changed = false;
			}
			if(filter_parameters.parameters_are_dirty) update_filter_coefficients(filter_parameters);
			return filter_parameters.input_rate_changed;
		}